

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

bool __thiscall
llama_context::state_save_file
          (llama_context *this,char *filepath,llama_token *tokens,size_t n_token_count)

{
  llama_file file;
  llama_io_write_file io;
  
  llama_file::llama_file(&file,filepath,"wb");
  llama_file::write_u32(&file,0x6767736e);
  llama_file::write_u32(&file,9);
  llama_file::write_u32(&file,(uint32_t)n_token_count);
  llama_file::write_raw(&file,tokens,n_token_count << 2);
  io.super_llama_io_write_i._vptr_llama_io_write_i =
       (_func_int **)&PTR__llama_io_write_file_002cd5e0;
  io.size_written = 0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io.file = &file;
  state_write_data(this,&io.super_llama_io_write_i);
  llama_io_write_file::~llama_io_write_file(&io);
  llama_file::~llama_file(&file);
  return true;
}

Assistant:

bool llama_context::state_save_file(const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_SESSION_MAGIC);
    file.write_u32(LLAMA_SESSION_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_write_data(io);

    return true;
}